

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::start_checking(torrent *this)

{
  uint uVar1;
  session_interface *psVar2;
  element_type *peVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  file_storage *this_00;
  undefined4 extraout_var_01;
  uint uVar14;
  int iVar15;
  int iVar16;
  piece_index_t index;
  vector<sha256_hash> hashes;
  undefined8 local_98;
  undefined8 uStack_90;
  pointer local_88;
  pointer pdStack_80;
  pointer local_78;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *local_40;
  long *local_38;
  
  iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  iVar12 = session_settings::get_int((session_settings *)CONCAT44(extraout_var,iVar12),0x4066);
  psVar2 = (this->super_torrent_hot_members).m_ses;
  uVar1 = (((this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length;
  uVar14 = 0x4000;
  if (uVar1 < 0x4000) {
    uVar14 = uVar1;
  }
  if ((int)uVar1 < 1) {
    uVar14 = 0x4000;
  }
  iVar15 = (int)(uVar14 * iVar12) / (int)uVar1;
  iVar12 = (*(psVar2->super_session_logger)._vptr_session_logger[0x2e])
                     (psVar2,(ulong)uVar1,
                      (long)(int)(uVar14 * iVar12) % (long)(int)uVar1 & 0xffffffff);
  iVar13 = session_settings::get_int((session_settings *)CONCAT44(extraout_var_00,iVar12),0x4065);
  iVar12 = 1;
  if (1 < iVar13) {
    iVar12 = iVar13;
  }
  iVar13 = iVar12 * 2;
  if (iVar15 != iVar13 && SBORROW4(iVar15,iVar13) == iVar15 + iVar12 * -2 < 0) {
    iVar13 = iVar15;
  }
  uVar1 = (this->m_checking_piece).m_val;
  iVar13 = ((this->m_num_checked_pieces).m_val - uVar1) + iVar13;
  if (0 < iVar13) {
    uVar14 = (((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_num_pieces;
    if ((int)uVar14 <= (int)uVar1) {
      UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
      (*UNRECOVERED_JUMPTABLE)
                (this,"start_checking, checking_piece >= num_pieces. %d >= %d",(ulong)uVar1,
                 (ulong)uVar14,UNRECOVERED_JUMPTABLE);
      return;
    }
    local_40 = (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>;
    iVar12 = 0;
    do {
      if (iVar12 == iVar13) break;
      index.m_val = (this->m_checking_piece).m_val;
      if ((this->super_torrent_hot_members).m_picker._M_t.
          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
          ._M_t.
          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
          (piece_picker *)0x0) {
        while (index.m_val <
               (((this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_files).m_num_pieces) {
          bVar10 = piece_picker::have_piece
                             ((this->super_torrent_hot_members).m_picker._M_t.
                              super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                              _M_head_impl,index);
          index.m_val = (this->m_checking_piece).m_val;
          if (!bVar10) break;
          index.m_val = index.m_val + 1;
          (this->m_checking_piece).m_val = index.m_val;
          (this->m_num_checked_pieces).m_val = (this->m_num_checked_pieces).m_val + 1;
        }
      }
      peVar3 = (this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3->m_files).m_num_pieces <= index.m_val) break;
      bVar10 = info_hash_t::has_v1(&peVar3->m_info_hash);
      hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar11 = info_hash_t::has_v2(&((this->super_torrent_hot_members).m_torrent_file.
                                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->m_info_hash);
      if (bVar11) {
        this_00 = torrent_info::orig_files
                            ((this->super_torrent_hot_members).m_torrent_file.
                             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
        iVar15 = file_storage::blocks_in_piece2
                           (this_00,(piece_index_t)(this->m_checking_piece).m_val);
        container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
        ::resize<int,void>((container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
                            *)&hashes,iVar15);
      }
      pdVar6 = hashes.
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pdVar4 = hashes.
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[4])();
      local_38 = (long *)CONCAT44(extraout_var_01,iVar15);
      uVar1 = (this->m_storage).m_idx.m_val;
      iVar15 = (this->m_checking_piece).m_val;
      ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::torrent,void>
                ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_98,
                 local_40);
      pdVar8 = hashes.
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pdVar7 = hashes.
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pdVar5 = hashes.
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = hashes.
                 super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pdStack_80 = hashes.
                   super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   .
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78 = pdVar8;
      hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      hashes.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = operator_new(0x28);
      uVar9 = uStack_90;
      uStack_90 = 0;
      *(undefined8 *)local_68._M_unused._0_8_ = local_98;
      *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = uVar9;
      local_98 = 0;
      *(pointer *)((long)local_68._M_unused._0_8_ + 0x10) = pdVar5;
      *(pointer *)((long)local_68._M_unused._0_8_ + 0x18) = pdVar7;
      *(pointer *)((long)local_68._M_unused._0_8_ + 0x20) = pdVar8;
      local_88 = (pointer)0x0;
      pdStack_80 = (pointer)0x0;
      local_78 = (pointer)0x0;
      pcStack_50 = ::std::
                   _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2455:7)>
                   ::_M_invoke;
      local_58 = ::std::
                 _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2455:7)>
                 ::_M_manager;
      (**(code **)(*local_38 + 0x20))
                (local_38,uVar1,iVar15,pdVar4,(long)pdVar6 - (long)pdVar4 >> 5,bVar10 << 5 | 0x18,
                 &local_68);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
      start_checking()::$_0::~__0((__0 *)&local_98);
      iVar16 = (this->m_checking_piece).m_val + 1;
      (this->m_checking_piece).m_val = iVar16;
      iVar15 = (((this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_files).m_num_pieces;
      ::std::_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
      ::~_Vector_base((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       *)&hashes);
      iVar12 = iVar12 + 1;
    } while (iVar16 < iVar15);
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f])
              ();
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"start_checking, m_checking_piece: %d",
               (ulong)(uint)(this->m_checking_piece).m_val);
  }
  return;
}

Assistant:

void torrent::start_checking() try
	{
		TORRENT_ASSERT(should_check_files());

		int num_outstanding = settings().get_int(settings_pack::checking_mem_usage) * block_size()
			/ m_torrent_file->piece_length();
		// if we only keep a single read operation in-flight at a time, we suffer
		// significant performance degradation. Always keep at least 4 jobs
		// outstanding per hasher thread
		int const min_outstanding
			= std::max(1, settings().get_int(settings_pack::hashing_threads)) * 2;
		if (num_outstanding < min_outstanding) num_outstanding = min_outstanding;

		// subtract the number of pieces we already have outstanding
		num_outstanding -= (static_cast<int>(m_checking_piece)
			- static_cast<int>(m_num_checked_pieces));
		if (num_outstanding <= 0) return;

		// we might already have some outstanding jobs, if we were paused and
		// resumed quickly, before the outstanding jobs completed
		if (m_checking_piece >= m_torrent_file->end_piece())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("start_checking, checking_piece >= num_pieces. %d >= %d"
				, static_cast<int>(m_checking_piece), m_torrent_file->num_pieces());
#endif
			return;
		}

		for (int i = 0; i < num_outstanding; ++i)
		{
			if (has_picker())
			{
				// skip pieces we already have
				while (m_checking_piece < m_torrent_file->end_piece()
					&& m_picker->have_piece(m_checking_piece))
				{
					++m_checking_piece;
					++m_num_checked_pieces;
				}
			}

			if (m_checking_piece >= m_torrent_file->end_piece()) break;

			auto flags = disk_interface::sequential_access | disk_interface::volatile_read;
			if (torrent_file().info_hashes().has_v1())
				flags |= disk_interface::v1_hash;
			aux::vector<sha256_hash> hashes;
			if (torrent_file().info_hashes().has_v2())
				hashes.resize(torrent_file().orig_files().blocks_in_piece2(m_checking_piece));

			span<sha256_hash> v2_span(hashes);
			m_ses.disk_thread().async_hash(m_storage, m_checking_piece, v2_span, flags
				, [self = shared_from_this(), hashes1 = std::move(hashes)]
				(piece_index_t p, sha1_hash const& h, storage_error const& error) mutable
				{ self->on_piece_hashed(std::move(hashes1), p, h, error); });
			++m_checking_piece;
			if (m_checking_piece >= m_torrent_file->end_piece()) break;
		}
		m_ses.deferred_submit_jobs();
#ifndef TORRENT_DISABLE_LOGGING
		debug_log("start_checking, m_checking_piece: %d"
			, static_cast<int>(m_checking_piece));
#endif
	}
	catch (...) { handle_exception(); }